

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_1ba5289::AddressDescriptor::MakeScripts
          (AddressDescriptor *this,vector<CPubKey,_std::allocator<CPubKey>_> *param_2,
          Span<const_CScript> param_3,FlatSigningProvider *param_4)

{
  long lVar1;
  CScript *in_RSI;
  vector<CScript,_std::allocator<CScript>_> *in_RDI;
  long in_FS_OFFSET;
  CTxDestination *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetScriptForDestination(in_stack_ffffffffffffff78);
  Vector<CScript>(in_RSI);
  CScript::~CScript((CScript *)in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>&, Span<const CScript>, FlatSigningProvider&) const override { return Vector(GetScriptForDestination(m_destination)); }